

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O3

LONG __thiscall
CorUnix::CSynchData::ReleaseAllLocalWaiters(CSynchData *this,CPalThread *pthrCurrent)

{
  ObjectDomain OVar1;
  uint uVar2;
  DWORD dwObjectIndex;
  ThreadWaitInfo *ptwiWaitInfo;
  DWORD DVar3;
  CPalSynchronizationManager *this_00;
  bool bVar4;
  bool bVar5;
  WaitCompletionState WVar6;
  PAL_ERROR PVar7;
  _WaitingThreadsListNode *pwtlnNode;
  DWORD *pWaitState;
  _WaitingThreadsListNode *p_Var8;
  uint local_44;
  int local_38;
  
  this_00 = CPalSynchronizationManager::s_pObjSynchMgr;
  DVar3 = gPID;
  OVar1 = this->m_odObjectDomain;
  if (OVar1 == SharedObject) {
    pwtlnNode = (_WaitingThreadsListNode *)SHMPtrToPtr((this->m_ptrWTLHead).shrid);
  }
  else {
    pwtlnNode = (this->m_ptrWTLHead).ptr;
  }
  if (pwtlnNode == (_WaitingThreadsListNode *)0x0) {
    local_38 = 0;
  }
  else {
    bVar4 = false;
    local_38 = 0;
    do {
      uVar2 = pwtlnNode->dwFlags;
      pWaitState = (DWORD *)SHMPtrToPtr(pwtlnNode->shridWaitingState);
      if (OVar1 == SharedObject) {
        p_Var8 = (_WaitingThreadsListNode *)SHMPtrToPtr((pwtlnNode->ptrNext).shrid);
      }
      else {
        p_Var8 = (pwtlnNode->ptrNext).ptr;
        if (pwtlnNode->dwProcessId != gPID) {
          fprintf(_stderr,"] %s %s:%d","ReleaseAllLocalWaiters",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x59a);
          fprintf(_stderr,"Expression: fSharedObject || pwtlnItem->dwProcessId == gPID\n");
        }
        if ((!bVar4) && (pwtlnNode->ptwiWaitInfo->wdWaitDomain != LocalWait)) {
          CPalSynchronizationManager::AcquireSharedSynchLock(pthrCurrent);
          bVar4 = true;
        }
      }
      if ((DVar3 == pwtlnNode->dwProcessId) &&
         (((uVar2 & 2) == 0 ||
          (WVar6 = IsRestOfWaitAllSatisfied(this,pwtlnNode), WVar6 == WaitIsSatisfied)))) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c8e16;
        bVar5 = CPalSynchronizationManager::InterlockedAwaken(pWaitState,false);
        if (bVar5) {
          if (PAL_InitializeChakraCoreCalled == false) {
LAB_002c8e16:
            abort();
          }
          dwObjectIndex = pwtlnNode->dwObjIndex;
          ptwiWaitInfo = pwtlnNode->ptwiWaitInfo;
          if (CObjectType::s_rgotIdMapping[this->m_otiObjectTypeId]->m_eOwnershipSemantics ==
              OwnershipTracked) {
            local_44 = (uint)this->m_fAbandoned;
            PVar7 = AssignOwnershipToThread(this,pthrCurrent,ptwiWaitInfo->pthrOwner);
            if ((PVar7 != 0) && (PAL_InitializeChakraCoreCalled == false)) goto LAB_002c8e16;
          }
          else {
            local_44 = 0;
          }
          if ((uVar2 & 2) != 0) {
            CPalSynchronizationManager::UnsignalRestOfLocalAwakeningWaitAll
                      (pthrCurrent,ptwiWaitInfo->pthrOwner,pwtlnNode,this);
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c8e16;
          CPalSynchronizationManager::UnRegisterWait
                    (this_00,pthrCurrent,ptwiWaitInfo,(bool)(OVar1 == SharedObject | bVar4));
          PVar7 = CPalSynchronizationManager::WakeUpLocalThread
                            (pthrCurrent,ptwiWaitInfo->pthrOwner,local_44 * 2,dwObjectIndex);
          if (PVar7 == 0) {
            local_38 = local_38 + 1;
          }
          else if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c8e16;
        }
      }
      pwtlnNode = p_Var8;
    } while (p_Var8 != (_WaitingThreadsListNode *)0x0);
    if (bVar4 != false) {
      CPalSynchronizationManager::ReleaseSharedSynchLock(pthrCurrent);
    }
  }
  return local_38;
}

Assistant:

LONG CSynchData::ReleaseAllLocalWaiters(
        CPalThread * pthrCurrent)
    {        
        PAL_ERROR palErr = NO_ERROR;
        LONG lAwakenedCount = 0;
        bool fSharedSynchLock = false;
        bool fSharedObject = (SharedObject == GetObjectDomain());
        DWORD * pdwWaitState;
        DWORD dwObjIdx;
        SharedID shridItem = NULLSharedID, shridNextItem = NULLSharedID;
        WaitingThreadsListNode * pwtlnItem, * pwtlnNextItem;
        DWORD dwPid = gPID;
        CPalSynchronizationManager * pSynchManager = 
            CPalSynchronizationManager::GetInstance();

        VALIDATEOBJECT(this);

        if (fSharedObject)
        {
            shridItem = GetWTLHeadShmPtr();
            pwtlnItem = SharedIDToTypePointer(WaitingThreadsListNode, shridItem);
        }
        else
        {
            pwtlnItem = GetWTLHeadPtr();
        }
            
        while (pwtlnItem)
        {
            VALIDATEOBJECT(pwtlnItem);
            
            bool fWaitAll = (0 != (WTLN_FLAG_WAIT_ALL & pwtlnItem->dwFlags));
            pdwWaitState = SharedIDToTypePointer(DWORD, 
                pwtlnItem->shridWaitingState);           

            if (fSharedObject)
            {
                shridNextItem = pwtlnItem->ptrNext.shrid;
                pwtlnNextItem = SharedIDToTypePointer(WaitingThreadsListNode, 
                                                  shridNextItem);
            }
            else
            {
                pwtlnNextItem = pwtlnItem->ptrNext.ptr;
            }    

            // See note in similar spot in ReleaseFirstWaiter
            
            _ASSERTE(fSharedObject || pwtlnItem->dwProcessId == gPID); 

            if (!fSharedSynchLock && !fSharedObject && 
                LocalWait != pwtlnItem->ptwiWaitInfo->wdWaitDomain)
            {
                CPalSynchronizationManager::AcquireSharedSynchLock(pthrCurrent);
                fSharedSynchLock = true;
            }   

            if( dwPid == pwtlnItem->dwProcessId &&
                (!fWaitAll || WaitIsSatisfied == IsRestOfWaitAllSatisfied(pwtlnItem)) )
            {
                //
                // Target wait is satisfied
                //
                TRACE("Trying to switch wait state [%p] from WAIT/ALERTABLE "
                      "to ACTIVE for thread=%u\n", 
                      pdwWaitState, pwtlnItem->dwThreadId);
                
                if (CPalSynchronizationManager::InterlockedAwaken(pdwWaitState, FALSE))
                {
                    TRACE("Succeeded switching wait state [%p] from WAIT/ALERTABLE "
                          "to TWS_ACTIVE for trhead=%u\n", 
                          pdwWaitState, pwtlnItem->dwThreadId);

                    dwObjIdx = pwtlnItem->dwObjIndex;
                    
                    ThreadWaitInfo * ptwiWaitInfo = pwtlnItem->ptwiWaitInfo;
                    bool fAbandoned = false;

                    if (CObjectType::OwnershipTracked ==
                        GetObjectType()->GetOwnershipSemantics())
                    {
                        // Get the abandoned status before resetting it by
                        // assigning ownership to target thread
                        fAbandoned = IsAbandoned();
                        
                        // Assign ownership to target thread
                        palErr = AssignOwnershipToThread(pthrCurrent,
                                                         ptwiWaitInfo->pthrOwner);
                        if (NO_ERROR != palErr)
                        {
                            ERROR("Synch Worker: AssignOwnershipToThread "
                                  "failed with error %u; ownership data on "
                                  "object with SynchData %p may be "
                                  "corrupted\n", palErr, this);
                        }
                    }

                    if (fWaitAll)
                    {
                        // Wait all satisfied: unsignal other objects 
                        // involved in the wait
                        CPalSynchronizationManager::UnsignalRestOfLocalAwakeningWaitAll(
                                                   pthrCurrent,
                                                   ptwiWaitInfo->pthrOwner,
                                                   pwtlnItem,
                                                   this);
                    }                        

                    TRACE("Unregistering wait for thread %u and waking it up "
                          "[pdwWaitState=%p]\n", pwtlnItem->dwThreadId, 
                          pdwWaitState);
                    
                    // Unregister the wait
                    pSynchManager->UnRegisterWait(pthrCurrent, 
                                                  ptwiWaitInfo, 
                                                  fSharedObject || fSharedSynchLock);

                    // After UnRegisterWait pwtlnItem is invalid
                    pwtlnItem = NULL; 
                                            
                    palErr = CPalSynchronizationManager::WakeUpLocalThread(
                        pthrCurrent, 
                        ptwiWaitInfo->pthrOwner, 
                        fAbandoned ? MutexAbondoned : WaitSucceeded,
                        dwObjIdx);
                    
                    if (NO_ERROR != palErr)
                    {
                        ERROR("Failed to wakeup local thread %#x: "
                              "object signaling may be "
                              "lost\n", ptwiWaitInfo->pthrOwner->GetThreadId());
                    }
                    else
                    {
                        // A thread has been awakened
                        lAwakenedCount++;
                    }
                }
            }

            // Go to the next item
            shridItem = shridNextItem;
            pwtlnItem = pwtlnNextItem;
        }

        if (fSharedSynchLock)
        {
            CPalSynchronizationManager::ReleaseSharedSynchLock(pthrCurrent);
        }        
        return lAwakenedCount;
    }